

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
additional_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(additional_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *results,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *patch)

{
  properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_00;
  pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_01;
  schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *psVar1;
  byte bVar2;
  pointer pvVar3;
  byte bVar4;
  bool bVar5;
  walk_result wVar6;
  int iVar7;
  iterator iVar8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *prop;
  pointer name;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *__k;
  walk_result wVar9;
  char cVar10;
  byte bVar11;
  walk_result local_2c4;
  collecting_error_listener local_reporter;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  json_pointer prop_location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  prop_context;
  json_pointer prop_location_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed_properties;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [16];
  
  bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                    (instance);
  if (!bVar5) {
    return advance;
  }
  allowed_properties._M_h._M_buckets = &allowed_properties._M_h._M_single_bucket;
  allowed_properties._M_h._M_bucket_count = 1;
  allowed_properties._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  allowed_properties._M_h._M_element_count = 0;
  allowed_properties._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  allowed_properties._M_h._M_rehash_policy._M_next_resize = 0;
  allowed_properties._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = *(properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              **)&(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).field_0xe0;
  wVar9 = abort;
  if (((this_00 !=
        (properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
         *)0x0) &&
      (local_2c4 = properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::validate(this_00,context,instance,instance_location,results,reporter,patch,
                              &allowed_properties), local_2c4 == abort)) ||
     ((this_01 = (this->pattern_properties_)._M_t.
                 super___uniq_ptr_impl<jsoncons::jsonschema::pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_jsoncons::jsonschema::pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 .
                 super__Head_base<0UL,_jsoncons::jsonschema::pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
                 ._M_head_impl,
      this_01 !=
      (pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
       *)0x0 && (wVar6 = pattern_properties_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                         ::validate(this_01,context,instance,instance_location,results,reporter,
                                    patch,&allowed_properties), wVar6 == abort))))
  goto LAB_003a9127;
  if ((this->additional_properties_)._M_t.
      super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl !=
      (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
       *)0x0) {
    eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::eval_context(&this_context,context,
                   &(this->
                    super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ).
                    super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    .keyword_name_);
    iVar7 = (*(((this->additional_properties_)._M_t.
                super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                .
                super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
               ._M_head_impl)->
              super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              )._vptr_validator_base[3])();
    if ((char)iVar7 == '\0') {
      iVar7 = (*(((this->additional_properties_)._M_t.
                  super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  .
                  super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
                 ._M_head_impl)->
                super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                )._vptr_validator_base[4])();
      if ((char)iVar7 == '\0') {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)local_268,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   instance);
        __k = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_268._0_8_;
        do {
          bVar5 = local_268[8] == (bool)local_258._M_local_buf[8];
          if ((local_268[8] & local_258._M_local_buf[8] & 1U) != 0) {
            bVar5 = __k == (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                            *)local_258._M_allocated_capacity;
          }
          if (bVar5) goto LAB_003a910e;
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&allowed_properties._M_h,&__k->key_);
          if (iVar8.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::eval_context(&prop_context,&this_context,&__k->key_,0);
            jsonpointer::operator/(&prop_location_1,instance_location,&__k->key_);
            local_reporter.super_error_reporter.error_count_ = 0;
            local_reporter.super_error_reporter._vptr_error_reporter =
                 (_func_int **)&PTR__collecting_error_listener_009a4f30;
            local_reporter.errors.
            super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_reporter.errors.
            super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_reporter.errors.
            super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            psVar1 = (this->additional_properties_)._M_t.
                     super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     .
                     super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
                     ._M_head_impl;
            iVar7 = (*(psVar1->
                      super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      )._vptr_validator_base[5])
                              (psVar1,&prop_context,&__k->value_,&prop_location_1,results,
                               &local_reporter,patch);
            if (iVar7 == 1) {
LAB_003a92ec:
              bVar5 = false;
              local_2c4 = abort;
            }
            else {
              if (local_reporter.errors.
                  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_reporter.errors.
                  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                if ((context->flags_ & require_evaluated_properties) != 0) {
                  std::__detail::
                  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)results,&__k->key_);
                }
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &prop_location,"Additional property \'",&__k->key_);
                std::operator+(&local_228,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &prop_location,"\' found but was invalid.");
                (*(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .super_validation_message_factory._vptr_validation_message_factory[2])
                          ((validation_message *)local_148,this,&this_context.eval_path_,
                           instance_location,&local_228);
                reporter->error_count_ = reporter->error_count_ + 1;
                iVar7 = (*reporter->_vptr_error_reporter[2])
                                  (reporter,(validation_message *)local_148);
                validation_message::~validation_message((validation_message *)local_148);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::string::~string((string *)&prop_location);
                if (iVar7 == 1) goto LAB_003a92ec;
              }
              bVar5 = true;
            }
            collecting_error_listener::~collecting_error_listener(&local_reporter);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&prop_location_1.tokens_);
            eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::~eval_context(&prop_context);
            if (!bVar5) goto LAB_003a93b0;
          }
          __k = __k + 1;
        } while( true );
      }
      if ((context->flags_ & require_evaluated_properties) != 0) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)local_148,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   instance);
        while( true ) {
          bVar5 = local_148[8] == (bool)local_138[0]._8_1_;
          if ((local_148[8] & local_138[0]._M_local_buf[8] & 1U) != 0) {
            bVar5 = local_148._0_8_ == local_138[0]._M_allocated_capacity;
          }
          if (bVar5) break;
          std::__detail::
          _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)results,(value_type *)local_148._0_8_);
          local_148._0_8_ = local_148._0_8_ + 0x30;
        }
      }
LAB_003a910e:
      bVar5 = true;
    }
    else {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)&local_reporter,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)instance
                );
      pvVar3 = local_reporter.errors.
               super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = (byte)local_reporter.super_error_reporter.error_count_;
      bVar4 = (byte)local_reporter.errors.
                    super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = (byte)local_reporter.super_error_reporter.error_count_ &
               (byte)local_reporter.errors.
                     super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      name = (pointer)local_reporter.super_error_reporter._vptr_error_reporter;
      do {
        bVar5 = bVar2 == bVar4;
        if ((bVar11 & 1) != 0) {
          bVar5 = name == pvVar3;
        }
        if (bVar5) goto LAB_003a910e;
        eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::eval_context(&prop_context,&this_context,&name->keyword_,0);
        jsonpointer::operator/
                  ((basic_json_pointer<char> *)&prop_location.tokens_,instance_location,
                   &name->keyword_);
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&allowed_properties._M_h,&name->keyword_);
        cVar10 = '\0';
        if (iVar8.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::operator+(&local_228,"Additional property \'",&name->keyword_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268,&local_228,"\' not allowed by schema.");
          (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[2])
                    ((validation_message *)local_148,this,&prop_context.eval_path_,
                     &prop_location.tokens_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268)
          ;
          reporter->error_count_ = reporter->error_count_ + 1;
          iVar7 = (*reporter->_vptr_error_reporter[2])(reporter,(validation_message *)local_148);
          validation_message::~validation_message((validation_message *)local_148);
          std::__cxx11::string::~string((string *)local_268);
          std::__cxx11::string::~string((string *)&local_228);
          if (iVar7 == 1) {
            local_2c4 = abort;
          }
          cVar10 = (iVar7 != 1) + '\x01';
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&prop_location.tokens_);
        eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::~eval_context(&prop_context);
        name = (pointer)&(name->eval_path_).tokens_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (cVar10 == '\0');
      bVar5 = cVar10 == '\x02';
    }
    goto LAB_003a9110;
  }
LAB_003a9125:
  wVar9 = advance;
LAB_003a9127:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&allowed_properties._M_h);
  return wVar9;
LAB_003a93b0:
  bVar5 = false;
LAB_003a9110:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context(&this_context);
  wVar9 = local_2c4;
  if (!bVar5) goto LAB_003a9127;
  goto LAB_003a9125;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            if (!instance.is_object())
            {
                return walk_result::advance;
            }

            std::unordered_set<std::string> allowed_properties;

            if (properties_)
            {
                walk_result result = properties_->validate(context, instance, instance_location, results, reporter, patch, allowed_properties);
                if (result == walk_result::abort)
                {
                    return result;
                }
            }

            if (pattern_properties_)
            {
                walk_result result = pattern_properties_->validate(context, instance, instance_location, results, reporter, patch, allowed_properties);
                if (result == walk_result::abort)
                {
                    return result;
                }
            }

            if (additional_properties_)
            {
                eval_context<Json> this_context(context, this->keyword_name());
                if (additional_properties_->always_fails())
                {
                    for (const auto& prop : instance.object_range()) 
                    {
                        eval_context<Json> prop_context{this_context, prop.key(), evaluation_flags{}};
                        jsonpointer::json_pointer prop_location = instance_location / prop.key();
                        // check if it is in "allowed properties"
                        auto prop_it = allowed_properties.find(prop.key());
                        if (prop_it == allowed_properties.end()) 
                        {
                            walk_result result = reporter.error(this->make_validation_message(
                                prop_context.eval_path(),
                                prop_location, 
                                "Additional property '" + prop.key() + "' not allowed by schema."));
                            if (result == walk_result::abort)
                            {
                                return result;
                            }
                            break;
                        }
                    }
                }
                else if (additional_properties_->always_succeeds())
                {
                    if (context.require_evaluated_properties())
                    {
                        for (const auto& prop : instance.object_range()) 
                        {
                            results.evaluated_properties.insert(prop.key());
                        }
                    }
                }
                else
                {
                    for (const auto& prop : instance.object_range()) 
                    {
                        // check if it is in "allowed properties"
                        auto prop_it = allowed_properties.find(prop.key());
                        if (prop_it == allowed_properties.end()) 
                        {
                            eval_context<Json> prop_context{this_context, prop.key(), evaluation_flags{}};
                            jsonpointer::json_pointer prop_location = instance_location / prop.key();

                            // finally, check "additionalProperties" 
                            //std::cout << "additional_properties_validator a_prop_or_pattern_matched " << a_prop_or_pattern_matched << ", " << bool(additional_properties_);
                            
                            //std::cout << " !!!additionalProperties!!!";
                            collecting_error_listener local_reporter;

                            walk_result result = additional_properties_->validate(prop_context, prop.value() , prop_location, results, local_reporter, patch);
                            if (result == walk_result::abort)
                            {
                                return result;
                            }
                            if (!local_reporter.errors.empty())
                            {
                                result = reporter.error(this->make_validation_message(
                                    this_context.eval_path(),
                                    instance_location, 
                                    "Additional property '" + prop.key() + "' found but was invalid."));
                                if (result == walk_result::abort)
                                {
                                    return result;
                                }
                            }
                            else if (context.require_evaluated_properties())
                            {
                                results.evaluated_properties.insert(prop.key());
                            }
                            
                        }
                        //std::cout << "\n";
                    }
                }
            }
            return walk_result::advance;
        }